

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O2

TOKEN CNetTokenManager::GenerateToken(NETADDR *pAddr,int64 Seed)

{
  long lVar1;
  uint uVar2;
  TOKEN TVar3;
  long lVar4;
  long in_FS_OFFSET;
  int64 Seed_local;
  char aBuf [32];
  NETADDR Addr;
  uchar local_48 [16];
  uint aDigest [4];
  
  while( true ) {
    lVar1 = *(long *)(in_FS_OFFSET + 0x28);
    Seed_local = Seed;
    if ((pAddr->type & 4) == 0) break;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00137649;
    pAddr = &GenerateToken::NullAddr;
  }
  mem_zero(&Addr,0x18);
  mem_copy(Addr.ip,pAddr->ip,0x10);
  Addr.type = pAddr->type;
  mem_copy(aBuf,&Addr,0x18);
  mem_copy(aBuf + 0x18,&Seed_local,8);
  local_48 = (uchar  [16])md5(aBuf,0x20);
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 4) {
    uVar2 = bytes_be_to_uint(local_48 + lVar4);
    *(uint *)((long)aDigest + lVar4) = uVar2;
  }
  uVar2 = aDigest[3] ^ aDigest[1] ^ aDigest[2] ^ aDigest[0];
  TVar3 = 0xfffffffe;
  if (uVar2 < 0xfffffffe) {
    TVar3 = uVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return TVar3;
  }
LAB_00137649:
  __stack_chk_fail();
}

Assistant:

TOKEN CNetTokenManager::GenerateToken(const NETADDR *pAddr, int64 Seed)
{
	static const NETADDR NullAddr = { 0 };
	NETADDR Addr;
	char aBuf[sizeof(NETADDR) + sizeof(int64)];
	unsigned int Result;

	if(pAddr->type & NETTYPE_LINK_BROADCAST)
		return GenerateToken(&NullAddr, Seed);

	mem_zero(&Addr, sizeof(NETADDR));
	mem_copy(Addr.ip, pAddr->ip, sizeof(Addr.ip));
	Addr.type = pAddr->type;

	mem_copy(aBuf, &Addr, sizeof(NETADDR));
	mem_copy(aBuf + sizeof(NETADDR), &Seed, sizeof(int64));

	Result = Hash(aBuf, sizeof(aBuf)) & NET_TOKEN_MASK;
	if(Result == NET_TOKEN_NONE)
		Result--;

	return Result;
}